

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::
Concat<cfd::core::ByteData256,cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
          (ByteData *this,ByteData256 *top,ByteData256 *args,ByteData *args_1,ByteData *args_2)

{
  ByteData *in_RDI;
  ByteData *in_R8;
  ByteData256 *in_R9;
  ByteData256 *in_stack_00000010;
  ByteData *in_stack_00000018;
  ByteData result;
  ByteData *in_stack_ffffffffffffffc0;
  ByteData *in_stack_ffffffffffffffc8;
  
  Concat<cfd::core::ByteData256>(in_stack_00000018,in_stack_00000010);
  Concat<cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  ~ByteData((ByteData *)0x402ee2);
  return in_RDI;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }